

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

SUNErrCode
SUNNonlinSolSetConvTestFn_FixedPoint
          (SUNNonlinearSolver NLS,SUNNonlinSolConvTestFn CTestFn,void *ctest_data)

{
  void *pvVar1;
  
  pvVar1 = NLS->content;
  *(SUNNonlinSolConvTestFn *)((long)pvVar1 + 8) = CTestFn;
  *(void **)((long)pvVar1 + 0xa8) = ctest_data;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolSetConvTestFn_FixedPoint(SUNNonlinearSolver NLS,
                                                SUNNonlinSolConvTestFn CTestFn,
                                                void* ctest_data)
{
  SUNFunctionBegin(NLS->sunctx);
  SUNAssert(CTestFn, SUN_ERR_ARG_CORRUPT);

  FP_CONTENT(NLS)->CTest = CTestFn;

  /* attach convergence test data */
  FP_CONTENT(NLS)->ctest_data = ctest_data;

  return SUN_SUCCESS;
}